

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O2

aiMesh * __thiscall
Assimp::IRRImporter::BuildSingleQuadMesh
          (IRRImporter *this,SkyboxVertex *v1,SkyboxVertex *v2,SkyboxVertex *v3,SkyboxVertex *v4)

{
  float fVar1;
  uint i;
  aiMesh *this_00;
  undefined8 *puVar2;
  void *pvVar3;
  long lVar4;
  aiVector3D *paVar5;
  
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  this_00->mPrimitiveTypes = 8;
  this_00->mNumFaces = 1;
  puVar2 = (undefined8 *)operator_new__(0x18);
  *puVar2 = 1;
  puVar2[2] = 0;
  this_00->mFaces = (aiFace *)(puVar2 + 1);
  *(undefined4 *)(puVar2 + 1) = 4;
  pvVar3 = operator_new__(0x10);
  puVar2[2] = pvVar3;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    *(int *)(puVar2[2] + lVar4 * 4) = (int)lVar4;
  }
  this_00->mNumVertices = 4;
  paVar5 = (aiVector3D *)operator_new__(0x30);
  this_00->mVertices = paVar5;
  paVar5->z = (v1->position).z;
  fVar1 = (v1->position).y;
  paVar5->x = (v1->position).x;
  paVar5->y = fVar1;
  paVar5[1].z = (v2->position).z;
  fVar1 = (v2->position).y;
  paVar5[1].x = (v2->position).x;
  paVar5[1].y = fVar1;
  fVar1 = (v3->position).y;
  paVar5[2].x = (v3->position).x;
  paVar5[2].y = fVar1;
  paVar5[2].z = (v3->position).z;
  fVar1 = (v4->position).y;
  paVar5[3].x = (v4->position).x;
  paVar5[3].y = fVar1;
  paVar5[3].z = (v4->position).z;
  paVar5 = (aiVector3D *)operator_new__(0x30);
  this_00->mNormals = paVar5;
  paVar5->z = (v1->normal).z;
  fVar1 = (v1->normal).y;
  paVar5->x = (v1->normal).x;
  paVar5->y = fVar1;
  paVar5[1].z = (v2->normal).z;
  fVar1 = (v2->normal).y;
  paVar5[1].x = (v2->normal).x;
  paVar5[1].y = fVar1;
  fVar1 = (v3->normal).y;
  paVar5[2].x = (v3->normal).x;
  paVar5[2].y = fVar1;
  paVar5[2].z = (v3->normal).z;
  fVar1 = (v4->normal).y;
  paVar5[3].x = (v4->normal).x;
  paVar5[3].y = fVar1;
  paVar5[3].z = (v4->normal).z;
  paVar5 = (aiVector3D *)operator_new__(0x30);
  this_00->mTextureCoords[0] = paVar5;
  paVar5->z = (v1->uv).z;
  fVar1 = (v1->uv).y;
  paVar5->x = (v1->uv).x;
  paVar5->y = fVar1;
  paVar5[1].z = (v2->uv).z;
  fVar1 = (v2->uv).y;
  paVar5[1].x = (v2->uv).x;
  paVar5[1].y = fVar1;
  fVar1 = (v3->uv).y;
  paVar5[2].x = (v3->uv).x;
  paVar5[2].y = fVar1;
  paVar5[2].z = (v3->uv).z;
  fVar1 = (v4->uv).y;
  paVar5[3].x = (v4->uv).x;
  paVar5[3].y = fVar1;
  paVar5[3].z = (v4->uv).z;
  return this_00;
}

Assistant:

aiMesh* IRRImporter::BuildSingleQuadMesh(const SkyboxVertex& v1,
    const SkyboxVertex& v2,
    const SkyboxVertex& v3,
    const SkyboxVertex& v4)
{
    // allocate and prepare the mesh
    aiMesh* out = new aiMesh();

    out->mPrimitiveTypes = aiPrimitiveType_POLYGON;
    out->mNumFaces = 1;

    // build the face
    out->mFaces    = new aiFace[1];
    aiFace& face   = out->mFaces[0];

    face.mNumIndices = 4;
    face.mIndices    = new unsigned int[4];
    for (unsigned int i = 0; i < 4;++i)
        face.mIndices[i] = i;

    out->mNumVertices = 4;

    // copy vertex positions
    aiVector3D* vec = out->mVertices = new aiVector3D[4];
    *vec++ = v1.position;
    *vec++ = v2.position;
    *vec++ = v3.position;
    *vec   = v4.position;

    // copy vertex normals
    vec = out->mNormals = new aiVector3D[4];
    *vec++ = v1.normal;
    *vec++ = v2.normal;
    *vec++ = v3.normal;
    *vec   = v4.normal;

    // copy texture coordinates
    vec = out->mTextureCoords[0] = new aiVector3D[4];
    *vec++ = v1.uv;
    *vec++ = v2.uv;
    *vec++ = v3.uv;
    *vec   = v4.uv;
    return out;
}